

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_next_cfdata(archive_read *a)

{
  short sVar1;
  ushort uVar2;
  void *pvVar3;
  long lVar4;
  uint16_t uVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  long request;
  int64_t iVar8;
  void *pvVar9;
  void *pvVar10;
  int local_44;
  wchar_t l;
  uchar *p;
  wchar_t folder_index;
  int64_t skip;
  cfdata *cfdata;
  cab *cab;
  archive_read *a_local;
  
  pvVar3 = a->format->data;
  lVar4 = *(long *)((long)pvVar3 + 0x38);
  if ((lVar4 != 0) && (*(short *)(lVar4 + 10) != 0)) {
    return L'\0';
  }
  if (lVar4 != 0) {
LAB_00b75314:
    if (*(int *)(*(long *)((long)pvVar3 + 0x28) + 0x58) <
        (int)(uint)*(ushort *)(*(long *)((long)pvVar3 + 0x28) + 4)) {
      lVar4 = *(long *)((long)pvVar3 + 0x28);
      *(int *)(*(long *)((long)pvVar3 + 0x28) + 0x58) =
           *(int *)(*(long *)((long)pvVar3 + 0x28) + 0x58) + 1;
      *(uint32_t **)((long)pvVar3 + 0x38) = (uint32_t *)(lVar4 + 0x18);
      *(undefined4 *)(lVar4 + 0x40) = 0;
      *(undefined4 *)(lVar4 + 0x48) = 0;
      *(undefined8 *)(lVar4 + 0x50) = 0;
      local_44 = 8;
      if ((*(ushort *)((long)pvVar3 + 0x54) & 4) != 0) {
        local_44 = *(byte *)((long)pvVar3 + 0x5d) + 8;
      }
      pvVar9 = __archive_read_ahead(a,(long)local_44,(ssize_t *)0x0);
      if (pvVar9 == (void *)0x0) {
        wVar6 = truncated_error(a);
        return wVar6;
      }
      uVar7 = archive_le32dec(pvVar9);
      *(uint32_t *)(lVar4 + 0x18) = uVar7;
      uVar5 = archive_le16dec((void *)((long)pvVar9 + 4));
      *(uint16_t *)(lVar4 + 0x1c) = uVar5;
      *(undefined2 *)(lVar4 + 0x1e) = *(undefined2 *)(lVar4 + 0x1c);
      uVar5 = archive_le16dec((void *)((long)pvVar9 + 6));
      *(uint16_t *)(lVar4 + 0x20) = uVar5;
      *(undefined2 *)(lVar4 + 0x22) = *(undefined2 *)(lVar4 + 0x20);
      *(undefined2 *)(lVar4 + 0x24) = 0;
      *(undefined2 *)(lVar4 + 0x26) = 0;
      *(undefined8 *)(lVar4 + 0x28) = 0;
      if ((((((*(short *)(lVar4 + 0x1c) == 0) || (0x9800 < *(ushort *)(lVar4 + 0x1c))) ||
            (0x8000 < *(ushort *)(lVar4 + 0x20))) ||
           ((*(short *)(lVar4 + 0x20) == 0 &&
            ((uVar2 = *(ushort *)(*(long *)((long)pvVar3 + 0x30) + 0x10), uVar2 == 0xfffd ||
             (uVar2 < 0xfffe)))))) ||
          ((*(int *)(*(long *)((long)pvVar3 + 0x28) + 0x58) <
            (int)(uint)*(ushort *)(*(long *)((long)pvVar3 + 0x28) + 4) &&
           (*(short *)(lVar4 + 0x20) != -0x8000)))) ||
         ((*(short *)(*(long *)((long)pvVar3 + 0x28) + 6) == 0 &&
          (*(short *)(lVar4 + 0x1c) != *(short *)(lVar4 + 0x20))))) {
        archive_set_error(&a->archive,0x54,"Invalid CFDATA");
        return L'\xffffffe2';
      }
      if (*(ulong *)(lVar4 + 0x30) < (ulong)(long)local_44) {
        free(*(void **)(lVar4 + 0x38));
        pvVar10 = malloc((long)local_44);
        *(void **)(lVar4 + 0x38) = pvVar10;
        if (*(long *)(lVar4 + 0x38) == 0) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory for CAB data");
          return L'\xffffffe2';
        }
        *(long *)(lVar4 + 0x30) = (long)local_44;
      }
      memcpy(*(void **)(lVar4 + 0x38),pvVar9,(long)local_44);
      __archive_read_consume(a,(long)local_44);
      *(long *)((long)pvVar3 + 0x40) = (long)local_44 + *(long *)((long)pvVar3 + 0x40);
    }
    else if (*(short *)(*(long *)((long)pvVar3 + 0x28) + 4) == 0) {
      pvVar9 = (void *)(*(long *)((long)pvVar3 + 0x28) + 0x18);
      *(void **)((long)pvVar3 + 0x38) = pvVar9;
      memset(pvVar9,0,0x40);
    }
    else {
      *(undefined2 *)(lVar4 + 4) = 0;
      *(undefined2 *)(lVar4 + 8) = 0;
      *(undefined2 *)(lVar4 + 6) = 0;
      *(undefined2 *)(lVar4 + 10) = 0;
    }
    return L'\0';
  }
  *(undefined4 *)(*(long *)((long)pvVar3 + 0x28) + 0x58) = 0;
  request = (ulong)**(uint **)((long)pvVar3 + 0x28) - *(long *)((long)pvVar3 + 0x40);
  if (-1 < request) {
    if (0 < request) {
      iVar8 = __archive_read_consume(a,request);
      if (iVar8 < 0) {
        return L'\xffffffe2';
      }
      *(ulong *)((long)pvVar3 + 0x40) = (ulong)**(uint **)((long)pvVar3 + 0x28);
    }
    goto LAB_00b75314;
  }
  sVar1 = *(short *)(*(long *)((long)pvVar3 + 0x30) + 0x10);
  if (sVar1 != -3) {
    if (sVar1 == -2) {
      p._4_4_ = *(ushort *)((long)pvVar3 + 0x50) - 1;
      goto LAB_00b7529d;
    }
    if (sVar1 != -1) {
      p._4_4_ = (uint)*(ushort *)(*(long *)((long)pvVar3 + 0x30) + 0x10);
      goto LAB_00b7529d;
    }
  }
  p._4_4_ = 0;
LAB_00b7529d:
  archive_set_error(&a->archive,-1,"Invalid offset of CFDATA in folder(%d) %jd < %jd",(ulong)p._4_4_
                    ,(ulong)**(uint **)((long)pvVar3 + 0x28),*(undefined8 *)((long)pvVar3 + 0x40));
  return L'\xffffffe2';
}

Assistant:

static int
cab_next_cfdata(struct archive_read *a)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata = cab->entry_cfdata;

	/* There are remaining bytes in current CFDATA, use it first. */
	if (cfdata != NULL && cfdata->uncompressed_bytes_remaining > 0)
		return (ARCHIVE_OK);

	if (cfdata == NULL) {
		int64_t skip;

		cab->entry_cffolder->cfdata_index = 0;

		/* Seek read pointer to the offset of CFDATA if needed. */
		skip = cab->entry_cffolder->cfdata_offset_in_cab
			- cab->cab_offset;
		if (skip < 0) {
			int folder_index;
			switch (cab->entry_cffile->folder) {
			case iFoldCONTINUED_FROM_PREV:
			case iFoldCONTINUED_PREV_AND_NEXT:
				folder_index = 0;
				break;
			case iFoldCONTINUED_TO_NEXT:
				folder_index = cab->cfheader.folder_count-1;
				break;
			default:
				folder_index = cab->entry_cffile->folder;
				break;
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid offset of CFDATA in folder(%d) %jd < %jd",
			    folder_index,
			    (intmax_t)cab->entry_cffolder->cfdata_offset_in_cab,
			    (intmax_t)cab->cab_offset);
			return (ARCHIVE_FATAL);
		}
		if (skip > 0) {
			if (__archive_read_consume(a, skip) < 0)
				return (ARCHIVE_FATAL);
			cab->cab_offset =
			    cab->entry_cffolder->cfdata_offset_in_cab;
		}
	}

	/*
	 * Read a CFDATA.
	 */
	if (cab->entry_cffolder->cfdata_index <
	    cab->entry_cffolder->cfdata_count) {
		const unsigned char *p;
		int l;

		cfdata = &(cab->entry_cffolder->cfdata);
		cab->entry_cffolder->cfdata_index++;
		cab->entry_cfdata = cfdata;
		cfdata->sum_calculated = 0;
		cfdata->sum_extra_avail = 0;
		cfdata->sum_ptr = NULL;
		l = 8;
		if (cab->cfheader.flags & RESERVE_PRESENT)
			l += cab->cfheader.cfdata;
		if ((p = __archive_read_ahead(a, l, NULL)) == NULL)
			return (truncated_error(a));
		cfdata->sum = archive_le32dec(p + CFDATA_csum);
		cfdata->compressed_size = archive_le16dec(p + CFDATA_cbData);
		cfdata->compressed_bytes_remaining = cfdata->compressed_size;
		cfdata->uncompressed_size =
		    archive_le16dec(p + CFDATA_cbUncomp);
		cfdata->uncompressed_bytes_remaining =
		    cfdata->uncompressed_size;
		cfdata->uncompressed_avail = 0;
		cfdata->read_offset = 0;
		cfdata->unconsumed = 0;

		/*
		 * Sanity check if data size is acceptable.
		 */
		if (cfdata->compressed_size == 0 ||
		    cfdata->compressed_size > (0x8000+6144))
			goto invalid;
		if (cfdata->uncompressed_size > 0x8000)
			goto invalid;
		if (cfdata->uncompressed_size == 0) {
			switch (cab->entry_cffile->folder) {
			case iFoldCONTINUED_PREV_AND_NEXT:
			case iFoldCONTINUED_TO_NEXT:
				break;
			case iFoldCONTINUED_FROM_PREV:
			default:
				goto invalid;
			}
		}
		/* If CFDATA is not last in a folder, an uncompressed
		 * size must be 0x8000(32KBi) */
		if ((cab->entry_cffolder->cfdata_index <
		     cab->entry_cffolder->cfdata_count) &&
		       cfdata->uncompressed_size != 0x8000)
			goto invalid;

		/* A compressed data size and an uncompressed data size must
		 * be the same in no compression mode. */
		if (cab->entry_cffolder->comptype == COMPTYPE_NONE &&
		    cfdata->compressed_size != cfdata->uncompressed_size)
			goto invalid;

		/*
		 * Save CFDATA image for sum check.
		 */
		if (cfdata->memimage_size < (size_t)l) {
			free(cfdata->memimage);
			cfdata->memimage = malloc(l);
			if (cfdata->memimage == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for CAB data");
				return (ARCHIVE_FATAL);
			}
			cfdata->memimage_size = l;
		}
		memcpy(cfdata->memimage, p, l);

		/* Consume bytes as much as we used. */
		__archive_read_consume(a, l);
		cab->cab_offset += l;
	} else if (cab->entry_cffolder->cfdata_count > 0) {
		/* Run out of all CFDATA in a folder. */
		cfdata->compressed_size = 0;
		cfdata->uncompressed_size = 0;
		cfdata->compressed_bytes_remaining = 0;
		cfdata->uncompressed_bytes_remaining = 0;
	} else {
		/* Current folder does not have any CFDATA. */
		cfdata = &(cab->entry_cffolder->cfdata);
		cab->entry_cfdata = cfdata;
		memset(cfdata, 0, sizeof(*cfdata));
	}
	return (ARCHIVE_OK);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid CFDATA");
	return (ARCHIVE_FATAL);
}